

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

void hydro_random_ensure_initialized(void)

{
  uint8_t *state_u8;
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  uchar *dst;
  uchar *buf;
  undefined8 *__buf;
  size_t __nbytes;
  long *in_FS_OFFSET;
  uchar *pnt_;
  pollfd local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  long local_38;
  
  if ((char)in_FS_OFFSET[-1] != '\0') {
    return;
  }
  lVar1 = *in_FS_OFFSET;
  iVar2 = open("/dev/random",0);
  if (iVar2 != -1) {
    local_70.events = 1;
    local_70.revents = 0;
    local_70.fd = iVar2;
    iVar3 = poll(&local_70,1,-1);
    if (iVar3 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) goto LAB_001049a6;
        iVar3 = poll(&local_70,1,-1);
      } while (iVar3 < 0);
    }
    if (iVar3 != 1) {
LAB_001049a6:
      close(iVar2);
      piVar4 = __errno_location();
      *piVar4 = 5;
      abort();
    }
    iVar2 = close(iVar2);
    if (iVar2 != 0) goto LAB_0010488d;
  }
  state_u8 = (uint8_t *)(lVar1 + -0x40);
  do {
    iVar2 = open("/dev/urandom",0);
    if (iVar2 != -1) {
      __buf = &local_68;
      __nbytes = 0x38;
      goto LAB_0010489f;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  goto LAB_0010488d;
  while( true ) {
    __buf = (undefined8 *)((long)__buf + lVar5);
    __nbytes = __nbytes - lVar5;
    if (__nbytes == 0) break;
LAB_0010489f:
    lVar5 = read(iVar2,__buf,__nbytes);
    if (lVar5 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
          iVar3 = -1;
          goto LAB_00104941;
        }
        lVar5 = read(iVar2,__buf,__nbytes);
      } while (lVar5 < 0);
    }
    if (lVar5 == 0) break;
  }
  iVar3 = -1;
  if ((long)__buf - (long)&local_68 == 0x38) {
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    *(undefined8 *)(lVar1 + -0x20) = uStack_48;
    *(undefined8 *)(lVar1 + -0x18) = uStack_40;
    *(undefined8 *)state_u8 = local_68;
    *(undefined8 *)(lVar1 + -0x38) = uStack_60;
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    in_FS_OFFSET[-2] = local_38;
    lVar5 = 0;
    do {
      *(undefined1 *)((long)&local_68 + lVar5) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x38);
    iVar3 = 0;
    local_70 = (pollfd)&local_68;
  }
LAB_00104941:
  iVar2 = close(iVar2);
  if (iVar2 == 0 && iVar3 == 0) {
    gimli_core_u8(state_u8,'\0');
    state_u8[0] = '\0';
    state_u8[1] = '\0';
    state_u8[2] = '\0';
    state_u8[3] = '\0';
    state_u8[4] = '\0';
    state_u8[5] = '\0';
    state_u8[6] = '\0';
    state_u8[7] = '\0';
    *(undefined8 *)(lVar1 + -0x38) = 0;
    in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
    in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
    gimli_core_u8(state_u8,'\0');
    *(undefined2 *)(in_FS_OFFSET + -1) = 0x1001;
    return;
  }
LAB_0010488d:
  abort();
}

Assistant:

static void
hydro_random_ensure_initialized(void)
{
    if (hydro_random_context.initialized == 0) {
        if (hydro_random_init() != 0) {
            abort();
        }
        gimli_core_u8(hydro_random_context.state, 0);
        hydro_random_ratchet();
        hydro_random_context.initialized = 1;
    }
}